

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::~IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralSurfaceConnection *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL> *)
             &(this->super_IfcStructuralConnection).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20,
             vtt + 0x28);
  IfcStructuralConnection::~IfcStructuralConnection(&this->super_IfcStructuralConnection,vtt + 1);
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}